

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O2

void __thiscall wasm::InstrumentMemory::visitStructGet(InstrumentMemory *this,StructGet *curr)

{
  Index x;
  uintptr_t uVar1;
  size_t sVar2;
  char *pcVar3;
  Call *expression;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Const *local_68;
  StructGet *local_60;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  Builder local_40;
  Builder builder;
  
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
       ).super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.
       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.currModule
  ;
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression.type.id;
  if (uVar1 - 2 < 4) {
    sVar2 = *(size_t *)(&PTR_DAT_00e1f050)[uVar1];
    pcVar3 = *(char **)(&PTR_DAT_00e1f030)[uVar1];
    x = this->id;
    this->id = x + 1;
    local_68 = Builder::makeConst<int>(&local_40,x);
    __l._M_len = 2;
    __l._M_array = (iterator)&local_68;
    local_60 = curr;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_58,__l,
               (allocator_type *)((long)&builder.wasm + 7));
    target.super_IString.str._M_str = pcVar3;
    target.super_IString.str._M_len = sVar2;
    expression = Builder::makeCall(&local_40,target,
                                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)&local_58,
                                   (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)61>).
                                         super_Expression.type.id,false);
    Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
                ).
                super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                .super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>,
               (Expression *)expression);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_58);
  }
  return;
}

Assistant:

void visitStructGet(StructGet* curr) {
    Builder builder(*getModule());
    Name target;
    if (curr->type == Type::i32) {
      target = struct_get_val_i32;
    } else if (curr->type == Type::i64) {
      target = struct_get_val_i64;
    } else if (curr->type == Type::f32) {
      target = struct_get_val_f32;
    } else if (curr->type == Type::f64) {
      target = struct_get_val_f64;
    } else {
      return; // TODO: other types, unreachable, etc.
    }
    replaceCurrent(builder.makeCall(
      target, {builder.makeConst(int32_t(id++)), curr}, curr->type));
  }